

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryAdd<FadCst<double>,_Fad<Fad<double>_>_>::val
          (value_type *__return_storage_ptr__,FadBinaryAdd<FadCst<double>,_Fad<Fad<double>_>_> *this
          )

{
  int iVar1;
  Fad<Fad<double>_> *pFVar2;
  double *pdVar3;
  long lVar4;
  int i;
  long lVar5;
  
  pFVar2 = this->right_;
  __return_storage_ptr__->val_ = (this->left_).constant_ + (pFVar2->val_).val_;
  iVar1 = (pFVar2->val_).dx_.num_elts;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (0 < (long)iVar1) {
    (__return_storage_ptr__->dx_).num_elts = iVar1;
    pdVar3 = (double *)operator_new__((long)iVar1 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar3;
  }
  __return_storage_ptr__->defaultVal = 0.0;
  lVar4 = (long)(pFVar2->val_).dx_.num_elts;
  if (0 < lVar4) {
    pdVar3 = (__return_storage_ptr__->dx_).ptr_to_data;
    lVar5 = 0;
    do {
      pdVar3[lVar5] = (pFVar2->val_).dx_.ptr_to_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}